

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O0

void __thiscall
TPZSparseBlockDiagonal<double>::TPZSparseBlockDiagonal
          (TPZSparseBlockDiagonal<double> *this,TPZVec<long> *blockgraph,
          TPZVec<long> *blockgraphindex,int64_t rows,int color,TPZVec<int> *colors)

{
  long lVar1;
  int64_t iVar2;
  int *piVar3;
  long *plVar4;
  long lVar5;
  undefined8 in_RCX;
  TPZVec<long> *in_RDX;
  TPZVec<long> *in_RSI;
  TPZRegisterClassId *in_RDI;
  int in_R8D;
  TPZVec<int> *in_R9;
  int64_t ieqcp;
  int64_t ieq;
  int64_t firstcp;
  int64_t last;
  int64_t first;
  int64_t graphsize;
  int64_t iblcount;
  int64_t ibl;
  int64_t numbl;
  void **in_stack_fffffffffffffed8;
  TPZBlockDiagonal<double> *in_stack_fffffffffffffee0;
  TPZVec<int> *in_stack_fffffffffffffef8;
  TPZBlockDiagonal<double> *in_stack_ffffffffffffff00;
  void **local_98;
  _func_int **local_90;
  long local_68;
  long local_60;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZSparseBlockDiagonal<double>>(in_RDI,0x21);
  TPZBlockDiagonal<double>::TPZBlockDiagonal(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  *(undefined ***)in_RDI = &PTR__TPZSparseBlockDiagonal_02419660;
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI + 0x80));
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI + 0xa0));
  iVar2 = TPZVec<long>::NElements(in_RDX);
  TPZVec<int>::Resize((TPZVec<int> *)in_stack_fffffffffffffee0,(int64_t)in_stack_fffffffffffffed8);
  local_68 = 0;
  for (local_60 = 0; local_60 < iVar2 + -1; local_60 = local_60 + 1) {
    piVar3 = TPZVec<int>::operator[](in_R9,local_60);
    if (*piVar3 == in_R8D) {
      plVar4 = TPZVec<long>::operator[](in_RDX,local_60 + 1);
      lVar1 = *plVar4;
      plVar4 = TPZVec<long>::operator[](in_RDX,local_60);
      lVar5 = *plVar4;
      piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x60),local_68);
      *piVar3 = (int)lVar1 - (int)lVar5;
      TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x60),local_68);
      local_68 = local_68 + 1;
    }
  }
  TPZVec<long>::Resize((TPZVec<long> *)in_stack_fffffffffffffee0,(int64_t)in_stack_fffffffffffffed8)
  ;
  TPZVec<long>::Resize((TPZVec<long> *)in_stack_fffffffffffffee0,(int64_t)in_stack_fffffffffffffed8)
  ;
  plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0xa0),0);
  *plVar4 = 0;
  local_68 = 0;
  for (local_60 = 0; local_60 < iVar2 + -1; local_60 = local_60 + 1) {
    in_stack_ffffffffffffff00 = (TPZBlockDiagonal<double> *)TPZVec<int>::operator[](in_R9,local_60);
    if (*(int *)&(in_stack_ffffffffffffff00->super_TPZMatrix<double>).super_TPZBaseMatrix.
                 super_TPZSavable._vptr_TPZSavable == in_R8D) {
      in_stack_fffffffffffffef8 = (TPZVec<int> *)TPZVec<long>::operator[](in_RDX,local_60);
      local_90 = in_stack_fffffffffffffef8->_vptr_TPZVec;
      plVar4 = TPZVec<long>::operator[](in_RDX,local_60 + 1);
      lVar1 = *plVar4;
      plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0xa0),local_68);
      local_98 = (void **)*plVar4;
      in_stack_fffffffffffffed8 = local_98;
      in_stack_fffffffffffffee0 =
           (TPZBlockDiagonal<double> *)
           TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x60),local_68);
      lVar5 = (long)in_stack_fffffffffffffed8 +
              (long)*(int *)&(in_stack_fffffffffffffee0->super_TPZMatrix<double>).
                             super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
      plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0xa0),local_68 + 1);
      *plVar4 = lVar5;
      for (; (long)local_90 < lVar1; local_90 = (_func_int **)((long)local_90 + 1)) {
        plVar4 = TPZVec<long>::operator[](in_RSI,(int64_t)local_90);
        lVar5 = *plVar4;
        plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x80),(int64_t)local_98);
        *plVar4 = lVar5;
        local_98 = (void **)((long)local_98 + 1);
      }
      local_68 = local_68 + 1;
    }
  }
  TPZVec<int>::Resize((TPZVec<int> *)in_stack_fffffffffffffee0,(int64_t)in_stack_fffffffffffffed8);
  TPZBlockDiagonal<double>::Initialize(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  *(undefined8 *)(in_RDI + 8) = in_RCX;
  *(undefined8 *)(in_RDI + 0x10) = in_RCX;
  return;
}

Assistant:

TPZSparseBlockDiagonal<TVar>::TPZSparseBlockDiagonal(TPZVec<int64_t> &blockgraph, TPZVec<int64_t> &blockgraphindex,int64_t rows, int color, TPZVec<int> &colors) : TPZRegisterClassId(&TPZSparseBlockDiagonal::ClassId)
{
#ifdef PZ_LOG
	LOGPZ_DEBUG(logger, "Constructor of TPZSparseBlockDiagonal");
#endif
	int64_t numbl = blockgraphindex.NElements()-1;
	this->fBlockSize.Resize(numbl);
	int64_t ibl,iblcount,graphsize = 0;
	for(ibl=0, iblcount=0; ibl<numbl; ibl++)
	{
		if(colors[ibl]==color) 
		{
			this->fBlockSize[iblcount++] = blockgraphindex[ibl+1]-blockgraphindex[ibl];
			graphsize += this->fBlockSize[iblcount-1];
		}
	}
	fBlock.Resize(graphsize);
	fBlockIndex.Resize(iblcount+1);
	fBlockIndex[0] = 0;
	for(ibl=0, iblcount=0; ibl<numbl; ibl++)
	{
		if(colors[ibl]==color) 
		{
			int64_t first = blockgraphindex[ibl];
			int64_t last = blockgraphindex[ibl+1];
			int64_t firstcp = fBlockIndex[iblcount];
			this->fBlockIndex[iblcount+1] = firstcp+this->fBlockSize[iblcount];
			//      int lastcp = fBlockIndex[iblcount+1];
			int64_t ieq,ieqcp;
			for(ieq=first,ieqcp=firstcp; ieq<last; ieq++,ieqcp++)
			{
				fBlock[ieqcp] = blockgraph[ieq];
			}
			iblcount++;
		}
	}
	this->fBlockSize.Resize(iblcount);
	this->Initialize(this->fBlockSize);
	this->fRow = rows;
	this->fCol = rows;
}